

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

void __thiscall
llm_build_arwkv7::llm_build_arwkv7
          (llm_build_arwkv7 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  llama_ubatch *plVar4;
  pointer plVar5;
  ggml_context *pgVar6;
  size_t sVar7;
  size_t sVar8;
  uint32_t uVar9;
  ggml_tensor *pgVar10;
  ggml_tensor *state_copy;
  ggml_tensor *state_mask;
  ggml_tensor *pgVar11;
  ggml_tensor *pgVar12;
  undefined8 uVar13;
  long lVar14;
  int iVar15;
  int il;
  long lVar16;
  long local_78;
  ggml_tensor *v_first;
  
  llm_graph_context::llm_graph_context((llm_graph_context *)this,params);
  (this->super_llm_build_rwkv7_base).model = model;
  uVar3 = (this->super_llm_build_rwkv7_base).super_llm_graph_context.n_embd;
  uVar9 = llama_hparams::n_embd_k_s
                    ((this->super_llm_build_rwkv7_base).super_llm_graph_context.hparams);
  if (uVar3 == uVar9) {
    v_first = (ggml_tensor *)0x0;
    pgVar10 = llm_graph_context::build_inp_embd((llm_graph_context *)this,model->tok_embd);
    state_copy = llm_graph_context::build_inp_s_copy((llm_graph_context *)this);
    state_mask = llm_graph_context::build_inp_s_mask((llm_graph_context *)this);
    plVar4 = (this->super_llm_build_rwkv7_base).super_llm_graph_context.ubatch;
    uVar9 = ((this->super_llm_build_rwkv7_base).super_llm_graph_context.hparams)->n_embd;
    uVar1 = plVar4->n_seq_tokens;
    uVar2 = plVar4->n_seqs;
    iVar15 = uVar1 - 1;
    local_78 = 0;
    for (lVar16 = 0; lVar16 < (this->super_llm_build_rwkv7_base).super_llm_graph_context.n_layer;
        lVar16 = lVar16 + 1) {
      plVar5 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pgVar10 = (ggml_tensor *)
                ggml_reshape_3d((this->super_llm_build_rwkv7_base).super_llm_graph_context.ctx0,
                                pgVar10,uVar9,uVar1,uVar2);
      il = (int)lVar16;
      pgVar11 = llm_graph_context::build_rwkv_token_shift_load
                          ((llm_graph_context *)this,gf,state_copy,state_mask,
                           (this->super_llm_build_rwkv7_base).super_llm_graph_context.ubatch,il);
      pgVar12 = llm_graph_context::build_norm
                          ((llm_graph_context *)this,pgVar10,
                           *(ggml_tensor **)((long)&plVar5->attn_norm + local_78),
                           *(ggml_tensor **)((long)&plVar5->attn_norm_b + local_78),LLM_NORM_RMS,il)
      ;
      llm_graph_context::cb((llm_graph_context *)this,pgVar12,"attn_norm",il);
      pgVar6 = (this->super_llm_build_rwkv7_base).super_llm_graph_context.ctx0;
      uVar13 = ggml_view_3d(pgVar6,pgVar12,uVar9,iVar15,uVar2,pgVar12->nb[1],pgVar12->nb[2],0);
      pgVar11 = (ggml_tensor *)ggml_concat(pgVar6,pgVar11,uVar13,1);
      pgVar11 = llm_build_rwkv7_base::build_rwkv7_time_mix
                          (&this->super_llm_build_rwkv7_base,gf,pgVar12,pgVar11,state_copy,
                           state_mask,&v_first,
                           (this->super_llm_build_rwkv7_base).super_llm_graph_context.ubatch,il);
      pgVar6 = (this->super_llm_build_rwkv7_base).super_llm_graph_context.ctx0;
      sVar7 = pgVar12->nb[1];
      sVar8 = pgVar12->nb[2];
      lVar14 = ggml_element_size(pgVar12);
      pgVar12 = (ggml_tensor *)
                ggml_view_3d(pgVar6,pgVar12,uVar9,1,uVar2,sVar7,sVar8,
                             lVar14 * (ulong)(uVar9 * iVar15));
      pgVar12 = llm_graph_context::build_rwkv_token_shift_store
                          ((llm_graph_context *)this,pgVar12,
                           (this->super_llm_build_rwkv7_base).super_llm_graph_context.ubatch,il);
      ggml_build_forward_expand(gf,pgVar12);
      pgVar10 = (ggml_tensor *)
                ggml_add((this->super_llm_build_rwkv7_base).super_llm_graph_context.ctx0,pgVar11,
                         pgVar10);
      llm_graph_context::cb((llm_graph_context *)this,pgVar10,"ffn_inp",il);
      if (lVar16 == (this->super_llm_build_rwkv7_base).super_llm_graph_context.n_layer + -1) {
        pgVar12 = llm_graph_context::build_inp_out_ids((llm_graph_context *)this);
        pgVar6 = (this->super_llm_build_rwkv7_base).super_llm_graph_context.ctx0;
        uVar13 = ggml_reshape_2d(pgVar6,pgVar11,uVar9,
                                 (long)(this->super_llm_build_rwkv7_base).super_llm_graph_context.
                                       n_tokens);
        ggml_get_rows(pgVar6,uVar13,pgVar12);
        pgVar6 = (this->super_llm_build_rwkv7_base).super_llm_graph_context.ctx0;
        uVar13 = ggml_reshape_2d(pgVar6,pgVar10,uVar9,
                                 (long)(this->super_llm_build_rwkv7_base).super_llm_graph_context.
                                       n_tokens);
        pgVar10 = (ggml_tensor *)ggml_get_rows(pgVar6,uVar13,pgVar12);
      }
      pgVar11 = llm_graph_context::build_norm
                          ((llm_graph_context *)this,pgVar10,
                           *(ggml_tensor **)
                            ((long)&((model->layers).
                                     super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->ffn_norm + local_78)
                           ,(ggml_tensor *)0x0,LLM_NORM_RMS,il);
      llm_graph_context::cb((llm_graph_context *)this,pgVar11,"ffn_norm",il);
      plVar5 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pgVar11 = llm_graph_context::build_ffn
                          ((llm_graph_context *)this,pgVar11,
                           *(ggml_tensor **)((long)&plVar5->ffn_up + local_78),(ggml_tensor *)0x0,
                           (ggml_tensor *)0x0,*(ggml_tensor **)((long)&plVar5->ffn_gate + local_78),
                           (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                           *(ggml_tensor **)((long)&plVar5->ffn_down + local_78),(ggml_tensor *)0x0,
                           (ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_SILU,LLM_FFN_PAR,il);
      llm_graph_context::cb((llm_graph_context *)this,pgVar11,"ffn_out",il);
      pgVar10 = (ggml_tensor *)
                ggml_add((this->super_llm_build_rwkv7_base).super_llm_graph_context.ctx0,pgVar11,
                         pgVar10);
      pgVar10 = llm_graph_context::build_cvec((llm_graph_context *)this,pgVar10,il);
      llm_graph_context::cb((llm_graph_context *)this,pgVar10,"l_out",il);
      local_78 = local_78 + 0x4f0;
    }
    pgVar10 = llm_graph_context::build_norm
                        ((llm_graph_context *)this,pgVar10,model->output_norm,model->output_norm_b,
                         LLM_NORM_RMS,-1);
    llm_graph_context::cb((llm_graph_context *)this,pgVar10,"result_norm",-1);
    ((this->super_llm_build_rwkv7_base).super_llm_graph_context.res._M_t.
     super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
     super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
     super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar10;
    pgVar10 = llm_graph_context::build_lora_mm((llm_graph_context *)this,model->output,pgVar10);
    llm_graph_context::cb((llm_graph_context *)this,pgVar10,"result_output",-1);
    ((this->super_llm_build_rwkv7_base).super_llm_graph_context.res._M_t.
     super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
     super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
     super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar10;
    ggml_build_forward_expand(gf,pgVar10);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,0x2efe,"GGML_ASSERT(%s) failed","n_embd == hparams.n_embd_k_s()");
}

Assistant:

llm_build_arwkv7(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_build_rwkv7_base(model, params) {
        GGML_ASSERT(n_embd == hparams.n_embd_k_s());

        ggml_tensor * cur;
        ggml_tensor * inpL;
        ggml_tensor * v_first = nullptr;

        inpL = build_inp_embd(model.tok_embd);

        ggml_tensor * state_copy = build_inp_s_copy();
        ggml_tensor * state_mask = build_inp_s_mask();

        const auto n_embd = hparams.n_embd;
        const auto n_seq_tokens = ubatch.n_seq_tokens;
        const auto n_seqs = ubatch.n_seqs;

        for (int il = 0; il < n_layer; ++il) {
            const llama_layer * layer = &model.layers[il];
            inpL = ggml_reshape_3d(ctx0, inpL, n_embd, n_seq_tokens, n_seqs);

            ggml_tensor * token_shift = build_rwkv_token_shift_load(
                    gf, state_copy, state_mask, ubatch, il
                    );

            ggml_tensor * att_norm = build_norm(inpL, layer->attn_norm, layer->attn_norm_b, LLM_NORM_RMS, il);
            cb(att_norm, "attn_norm", il);

            ggml_tensor * x_prev = ggml_concat(
                    ctx0,
                    token_shift,
                    ggml_view_3d(ctx0, att_norm, n_embd, n_seq_tokens - 1, n_seqs, att_norm->nb[1], att_norm->nb[2], 0),
                    1
                    );

            cur = build_rwkv7_time_mix(gf, att_norm, x_prev, state_copy, state_mask, v_first, ubatch, il);

            token_shift = ggml_view_3d(ctx0, att_norm, n_embd, 1, n_seqs, att_norm->nb[1], att_norm->nb[2], (n_seq_tokens-1)*n_embd*ggml_element_size(att_norm));
            ggml_build_forward_expand(gf, build_rwkv_token_shift_store(token_shift, ubatch, il));

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpL);
            cb(ffn_inp, "ffn_inp", il);

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                struct ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur     = ggml_get_rows(ctx0, ggml_reshape_2d(ctx0, cur, n_embd, n_tokens), inp_out_ids);
                ffn_inp = ggml_get_rows(ctx0, ggml_reshape_2d(ctx0, ffn_inp, n_embd, n_tokens), inp_out_ids);
            }

            // feed-forward network
            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            cur = build_ffn(cur,
                    model.layers[il].ffn_up,   NULL, NULL,
                    model.layers[il].ffn_gate, NULL, NULL,
                    model.layers[il].ffn_down, NULL, NULL,
                    NULL,
                    LLM_FFN_SILU, LLM_FFN_PAR, il);
            cb(cur, "ffn_out", il);

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;
        cur = build_norm(cur, model.output_norm, model.output_norm_b, LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }